

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

MemoryInit * __thiscall
wasm::Builder::makeMemoryInit
          (Builder *this,Name segment,Expression *dest,Expression *offset,Expression *size,
          Name memory)

{
  MemoryInit *pMVar1;
  
  pMVar1 = MixedArena::alloc<wasm::MemoryInit>((MixedArena *)(this->wasm + 0x200));
  (pMVar1->segment).super_IString.str._M_len = segment.super_IString.str._M_len;
  (pMVar1->segment).super_IString.str._M_str = segment.super_IString.str._M_str;
  pMVar1->dest = dest;
  pMVar1->offset = offset;
  pMVar1->size = size;
  (pMVar1->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (pMVar1->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  wasm::MemoryInit::finalize();
  return pMVar1;
}

Assistant:

MemoryInit* makeMemoryInit(Name segment,
                             Expression* dest,
                             Expression* offset,
                             Expression* size,
                             Name memory) {
    auto* ret = wasm.allocator.alloc<MemoryInit>();
    ret->segment = segment;
    ret->dest = dest;
    ret->offset = offset;
    ret->size = size;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }